

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

void tclpkcs11_unloadall(ClientData cd)

{
  char *pcVar1;
  code *pcVar2;
  Tcl_HashEntry *pTVar3;
  Tcl_HashSearch search;
  Tcl_HashSearch local_30;
  
  if (cd != (ClientData)0x0) {
    pTVar3 = (*tclStubsPtr->tcl_FirstHashEntry)((Tcl_HashTable *)cd,&local_30);
    while (pTVar3 != (Tcl_HashEntry *)0x0) {
      pcVar1 = (char *)pTVar3->clientData;
      if ((*(long *)(pcVar1 + 8) != 0) &&
         (pcVar2 = *(code **)(*(long *)(pcVar1 + 8) + 0x10), pcVar2 != (code *)0x0)) {
        (*pcVar2)(0);
      }
      dlclose(*(undefined8 *)pcVar1);
      (*tclStubsPtr->tcl_Free)(pcVar1);
      pTVar3 = (*tclStubsPtr->tcl_NextHashEntry)(&local_30);
    }
  }
  return;
}

Assistant:

MODULE_SCOPE void tclpkcs11_unloadall(ClientData cd) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_HashSearch search;

  if (!cd) {
    return;
  }

  interpdata = (struct tclpkcs11_interpdata *) cd;

  for (
  tcl_handle_entry = Tcl_FirstHashEntry(&interpdata->handles, &search);
  tcl_handle_entry;
  tcl_handle_entry = Tcl_NextHashEntry(&search)
  ) {

    handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);

    if (handle->pkcs11 && handle->pkcs11->C_Finalize) {
      handle->pkcs11->C_Finalize(NULL);
    }

    tclpkcs11_int_unload_module(handle->base);

    ckfree((char *) handle);

  }

  return;
}